

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_text_fields
                 (lysp_ctx *ctx,lysp_stmt *stmt,char ***texts,yang_arg arg,lysp_ext_instance **exts)

{
  char **ppcVar1;
  LY_ERR LVar2;
  char *pcVar3;
  char *pcVar4;
  ly_ctx *local_a8;
  char *local_a0;
  ly_ctx *local_80;
  ly_ctx *local_78;
  ly_ctx *local_70;
  lysp_stmt *plStack_60;
  LY_ERR ret___2;
  lysp_stmt *child;
  undefined8 *puStack_50;
  LY_ERR ret___1;
  char *p__;
  LY_ERR ret__;
  char **item;
  lysp_ext_instance **exts_local;
  yang_arg arg_local;
  char ***texts_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  ctx_local._4_4_ = lysp_stmt_validate_value(ctx,arg,stmt->arg);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    if (*texts == (char **)0x0) {
      puStack_50 = (undefined8 *)malloc(0x10);
      if (puStack_50 == (undefined8 *)0x0) {
        if (ctx == (lysp_ctx *)0x0) {
          local_78 = (ly_ctx *)0x0;
        }
        else {
          local_78 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_log(local_78,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_text_fields")
        ;
        return LY_EMEM;
      }
      *puStack_50 = 1;
    }
    else {
      (*texts)[-1] = (*texts)[-1] + 1;
      puStack_50 = (undefined8 *)realloc(*texts + -1,(long)(*texts)[-1] * 8 + 8);
      if (puStack_50 == (undefined8 *)0x0) {
        (*texts)[-1] = (*texts)[-1] + -1;
        if (ctx == (lysp_ctx *)0x0) {
          local_70 = (ly_ctx *)0x0;
        }
        else {
          local_70 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_log(local_70,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_text_fields")
        ;
        return LY_EMEM;
      }
    }
    *texts = (char **)(puStack_50 + 1);
    ppcVar1 = *texts;
    pcVar3 = (*texts)[-1];
    memset(ppcVar1 + (long)(pcVar3 + -1),0,8);
    if (ctx == (lysp_ctx *)0x0) {
      local_80 = (ly_ctx *)0x0;
    }
    else {
      local_80 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ctx_local._4_4_ = lydict_insert(local_80,stmt->arg,0,ppcVar1 + (long)(pcVar3 + -1));
    if (ctx_local._4_4_ == LY_SUCCESS) {
      for (plStack_60 = stmt->child; plStack_60 != (lysp_stmt *)0x0; plStack_60 = plStack_60->next)
      {
        if (plStack_60->kw != LY_STMT_EXTENSION_INSTANCE) {
          if (ctx == (lysp_ctx *)0x0) {
            local_a8 = (ly_ctx *)0x0;
          }
          else {
            local_a8 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar3 = lyplg_ext_stmt2str(plStack_60->kw);
          pcVar4 = lyplg_ext_stmt2str(stmt->kw);
          ly_vlog(local_a8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,pcVar4);
          return LY_EVALID;
        }
        if (*texts == (char **)0x0) {
          local_a0 = (char *)0x0;
        }
        else {
          local_a0 = (*texts)[-1];
        }
        LVar2 = lysp_stmt_ext(ctx,plStack_60,stmt->kw,(uint64_t)(local_a0 + -1),exts);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
      }
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_text_fields(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, const char ***texts, enum yang_arg arg,
        struct lysp_ext_instance **exts)
{
    const char **item;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, arg, stmt->arg));

    /* allocate new pointer */
    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *texts, item, LY_EMEM);
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, item));

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, LY_ARRAY_COUNT(*texts) - 1, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(stmt->kw));
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}